

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t sysbvm_functionBytecodeAssembler_create(sysbvm_context_t *context)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_functionBytecodeAssembler_t *result;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionBytecodeAssembler,0xc);
  sVar2 = sysbvm_array_create(context,0);
  (psVar1->field_1).pointers[0] = sVar2;
  sVar2 = sysbvm_array_create(context,0);
  psVar1[1].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[1].header.identityHashAndFlags = (int)sVar2;
  psVar1[1].header.objectSize = (int)(sVar2 >> 0x20);
  sVar2 = sysbvm_identityDictionary_create(context);
  psVar1[1].field_1.pointers[0] = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[2].header.field_0.typePointer = sVar2;
  sVar2 = sysbvm_orderedCollection_create(context);
  psVar1[2].header.identityHashAndFlags = (int)sVar2;
  psVar1[2].header.objectSize = (int)(sVar2 >> 0x20);
  sVar2 = sysbvm_tuple_size_encode(context,0);
  psVar1[2].field_1.pointers[0] = sVar2;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_create(sysbvm_context_t *context)
{
    sysbvm_functionBytecodeAssembler_t *result = (sysbvm_functionBytecodeAssembler_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeAssembler, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecodeAssembler_t));
    result->arguments = sysbvm_array_create(context, 0);
    result->captures = sysbvm_array_create(context, 0);
    result->literals = sysbvm_orderedCollection_create(context);
    result->literalDictionary = sysbvm_identityDictionary_create(context);
    result->temporaries = sysbvm_orderedCollection_create(context);
    result->temporaryTypes = sysbvm_orderedCollection_create(context);
    result->usedTemporaryCount = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}